

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Entity_State_PDU::Decode(Entity_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  *this_00;
  KUINT16 KVar1;
  SeparationPart *pSVar2;
  KException *this_01;
  int iVar3;
  undefined7 in_register_00000011;
  byte bVar4;
  KUINT8 paramTyp;
  KString local_50;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar3 = 0;
  }
  if (iVar3 + (uint)KVar1 < 0x90) {
    this_01 = (KException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Decode",(allocator<char> *)&paramTyp);
    KException::KException(this_01,&local_50,2);
    __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
  }
  this_00 = &this->m_vVariableParameters;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ::clear(this_00);
  Header7::Decode(&this->super_Header,stream,ignoreHeader);
  (*(this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EntityID,stream);
  KDataStream::Read(stream,&this->m_ui8ForceID);
  KDataStream::Read(stream,&this->m_ui8NumOfVariableParams);
  (*(this->m_EntityType).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EntityType,stream);
  (*(this->m_AltEntityType).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_AltEntityType,stream)
  ;
  (*(this->m_EntityLinearVelocity).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EntityLinearVelocity,stream);
  (*(this->m_EntityLocation).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EntityLocation,stream);
  (*(this->m_EntityOrientation).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EntityOrientation,stream);
  (*(this->m_EntityAppearance).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EntityAppearance,stream);
  (*(this->m_DeadReckoningParameter).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_DeadReckoningParameter,stream);
  (*(this->m_EntityMarking).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EntityMarking,stream)
  ;
  (*(this->m_EntityCapabilities).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EntityCapabilities,stream);
  bVar4 = 0;
  do {
    if (this->m_ui8NumOfVariableParams <= bVar4) {
      return;
    }
    KVar1 = KDataStream::GetCurrentWritePosition(stream);
    KDataStream::Read(stream,&paramTyp);
    KDataStream::SetCurrentWritePosition(stream,KVar1);
    pSVar2 = (SeparationPart *)
             DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::VariableParameter>::FactoryDecode
                       ((uint)paramTyp,stream);
    if (pSVar2 == (SeparationPart *)0x0) {
      if (paramTyp == '\x03') {
        pSVar2 = (SeparationPart *)operator_new(0x48);
        DATA_TYPE::SeparationPart::SeparationPart(pSVar2,stream);
        local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00214700;
        local_50._M_string_length = (size_type)pSVar2;
        local_50.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_50.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                    *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_50);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::~KRef_Ptr
                  ((KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_50);
LAB_00133695:
        pSVar2 = (SeparationPart *)operator_new(0x18);
        DATA_TYPE::VariableParameter::VariableParameter((VariableParameter *)pSVar2,stream);
        local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00214700;
        local_50._M_string_length = (size_type)pSVar2;
        local_50.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_50.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                    *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_50);
      }
      else if (paramTyp == '\x01') {
        pSVar2 = (SeparationPart *)operator_new(0x30);
        DATA_TYPE::AttachedPart::AttachedPart((AttachedPart *)pSVar2,stream);
        local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00214700;
        local_50._M_string_length = (size_type)pSVar2;
        local_50.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_50.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                    *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_50);
      }
      else {
        if (paramTyp != '\0') goto LAB_00133695;
        pSVar2 = (SeparationPart *)operator_new(0x28);
        DATA_TYPE::ArticulatedPart::ArticulatedPart((ArticulatedPart *)pSVar2,stream);
        local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00214700;
        local_50._M_string_length = (size_type)pSVar2;
        local_50.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_50.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                    *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_50);
      }
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00214700;
      local_50._M_string_length = (size_type)pSVar2;
      local_50.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_50.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                  *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_50);
    }
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::~KRef_Ptr
              ((KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_50);
    bVar4 = bVar4 + 1;
  } while( true );
}

Assistant:

void Entity_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < ENTITY_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vVariableParameters.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EntityID
           >> m_ui8ForceID
           >> m_ui8NumOfVariableParams
           >> KDIS_STREAM m_EntityType
           >> KDIS_STREAM m_AltEntityType
           >> KDIS_STREAM m_EntityLinearVelocity
           >> KDIS_STREAM m_EntityLocation
           >> KDIS_STREAM m_EntityOrientation
           >> KDIS_STREAM m_EntityAppearance
           >> KDIS_STREAM m_DeadReckoningParameter
           >> KDIS_STREAM m_EntityMarking
           >> KDIS_STREAM m_EntityCapabilities;

    for( KUINT8 i = 0; i < m_ui8NumOfVariableParams; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT8 paramTyp;

        // Extract the  type then reset the stream.
        stream >> paramTyp;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        VariableParameter * p = VariableParameter::FactoryDecode( paramTyp, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vVariableParameters.push_back( VarPrmPtr( p ) );
        }
        else
        {
            // Default internals
            switch( paramTyp )
            {
                case ArticulatedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new ArticulatedPart( stream ) ) );
                    break;

                case AttachedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new AttachedPart( stream ) ) );
                    break;

                #if DIS_VERSION > 5
                case SeparationPartType:
                    m_vVariableParameters.push_back(VarPrmPtr(new SeparationPart(stream)));
                #endif

                default:
                    m_vVariableParameters.push_back( VarPrmPtr( new VariableParameter( stream ) ) );
                    break;
            }
        }
    }
}